

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_rdrand_x86_64(CPUX86State *env)

{
  int iVar1;
  CPUX86State *local_20;
  target_ulong ret;
  CPUX86State *env_local;
  
  ret = (target_ulong)env;
  iVar1 = qemu_guest_getrandom(&local_20,8);
  if (iVar1 < 0) {
    *(undefined8 *)(ret + 0x98) = 0;
    env_local = (CPUX86State *)0x0;
  }
  else {
    *(undefined8 *)(ret + 0x98) = 1;
    env_local = local_20;
  }
  return (target_ulong)env_local;
}

Assistant:

target_ulong HELPER(rdrand)(CPUX86State *env)
{
    target_ulong ret;

    if (qemu_guest_getrandom(&ret, sizeof(ret)) < 0) {
        // qemu_log_mask(LOG_UNIMP, "rdrand: Crypto failure: %s",
        //               error_get_pretty(err));
        // error_free(err);
        /* Failure clears CF and all other flags, and returns 0.  */
        env->cc_src = 0;
        return 0;
    }

    /* Success sets CF and clears all others.  */
    env->cc_src = CC_C;
    return ret;
}